

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O1

void __thiscall
FPCXTexture::ReadPCX24bits(FPCXTexture *this,BYTE *dst,FileReader *lump,PCXHeader *hdr,int planes)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  BYTE *pBVar8;
  ulong uVar9;
  byte *pbVar10;
  
  uVar9 = lump->Length - 0x80;
  pbVar1 = (byte *)operator_new__(uVar9);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pbVar1,uVar9);
  if ((this->super_FTexture).Height != 0) {
    iVar2 = 0;
    iVar7 = 0;
    uVar5 = 0;
    bVar6 = 0;
    pbVar4 = pbVar1;
    do {
      if (0 < planes) {
        uVar9 = 0;
        pBVar8 = dst;
        do {
          uVar3 = (uint)hdr->bytesPerScanLine;
          if (hdr->bytesPerScanLine != 0) {
            pbVar10 = pBVar8 + (int)((uint)(this->super_FTexture).Width * iVar2);
            do {
              if (iVar7 == 0) {
                bVar6 = *pbVar4;
                if (bVar6 < 0xc0) {
                  pbVar4 = pbVar4 + 1;
                  iVar7 = 1;
                }
                else {
                  iVar7 = bVar6 - 0xc0;
                  bVar6 = pbVar4[1];
                  pbVar4 = pbVar4 + 2;
                }
              }
              uVar3 = uVar3 - 1;
              iVar7 = iVar7 + -1;
              *pbVar10 = bVar6;
              pbVar10 = pbVar10 + planes;
            } while (uVar3 != 0);
          }
          uVar9 = uVar9 + 1;
          pBVar8 = pBVar8 + 1;
        } while (uVar9 != (uint)planes);
      }
      uVar5 = uVar5 + 1;
      iVar2 = iVar2 + planes;
    } while (uVar5 < (this->super_FTexture).Height);
  }
  operator_delete__(pbVar1);
  return;
}

Assistant:

void FPCXTexture::ReadPCX24bits (BYTE *dst, FileReader & lump, PCXHeader *hdr, int planes)
{
	int rle_count = 0, rle_value = 0;
	int y, c;
	int bytes;

	BYTE * srcp = new BYTE[lump.GetLength() - sizeof(PCXHeader)];
	lump.Read(srcp, lump.GetLength() - sizeof(PCXHeader));
	BYTE * src = srcp;

	for (y = 0; y < Height; ++y)
	{
		/* for each color plane */
		for (c = 0; c < planes; ++c)
		{
			BYTE * ptr = &dst[y * Width * planes];
			bytes = hdr->bytesPerScanLine;

			while (bytes--)
			{
				if (rle_count == 0)
				{
					if( (rle_value = *src++) < 0xc0)
					{
						rle_count = 1;
					}
					else
					{
						rle_count = rle_value - 0xc0;
						rle_value = *src++;
					}
				}

				rle_count--;
				ptr[c] = (BYTE)rle_value;
				ptr += planes;
			}
		}
	}
	delete [] srcp;
}